

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgn.cpp
# Opt level: O1

bool __thiscall pgn::parse_files(pgn *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  istream *piVar5;
  size_type sVar6;
  bool bVar7;
  pointer pbVar8;
  game g;
  string line;
  istringstream fen;
  istringstream tmp;
  ifstream pgn_file;
  position p;
  game gStack_24e48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_24e20;
  pointer pbStack_24e00;
  istringstream aiStack_24df8 [120];
  ios_base aiStack_24d80 [264];
  istringstream aiStack_24c78 [120];
  ios_base aiStack_24c00 [264];
  long alStack_24af8 [65];
  position pStack_248f0;
  
  pbVar8 = (this->pgn_files).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbStack_24e00 =
       (this->pgn_files).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar8 != pbStack_24e00) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"..parsing games from ",0x15);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(pbVar8->_M_dataplus)._M_p,pbVar8->_M_string_length)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      std::ifstream::ifstream((istream *)alStack_24af8,(pbVar8->_M_dataplus)._M_p,_S_in);
      cVar1 = std::__basic_file<char>::is_open();
      if (cVar1 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"..failed to open pgn file, skipping",0x23);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
        std::ostream::put(-0x58);
        std::ostream::flush();
      }
      else {
        bStack_24e20._M_dataplus._M_p = (pointer)&bStack_24e20.field_2;
        bStack_24e20._M_string_length = 0;
        bStack_24e20.field_2._M_local_buf[0] = '\0';
        gStack_24e48.moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        gStack_24e48.moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        gStack_24e48.moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        gStack_24e48.result = pgn_none;
        gStack_24e48.white_elo = 0;
        gStack_24e48.black_elo = 0;
        position::position(&pStack_248f0);
        std::__cxx11::istringstream::istringstream
                  (aiStack_24df8,(string *)&START_FEN_abi_cxx11_,_S_in);
        position::setup(&pStack_248f0,(istringstream *)aiStack_24df8);
        bVar7 = true;
        while( true ) {
          cVar1 = std::ios::widen((char)*(undefined8 *)(alStack_24af8[0] + -0x18) +
                                  (char)(istream *)alStack_24af8);
          piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)alStack_24af8,(string *)&bStack_24e20,cVar1);
          if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
          if ((((bStack_24e20._M_string_length == 0) ||
               (iVar3 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (&bStack_24e20,"\n"), iVar3 == 0)) ||
              (sVar6 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                 (&bStack_24e20,"[",0,1), sVar6 != 0xffffffffffffffff)) ||
             (sVar6 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                (&bStack_24e20,"]",0,1), sVar6 != 0xffffffffffffffff)) {
            sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::find(&bStack_24e20,"[WhiteElo",0,9);
            if ((sVar6 != 0xffffffffffffffff) ||
               (sVar6 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                  (&bStack_24e20,"[BlackElo",0,9), sVar6 != 0xffffffffffffffff)) {
              parse_elo(this,&gStack_24e48,&bStack_24e20);
            }
          }
          else {
            bVar2 = parse_moves(this,&pStack_248f0,&bStack_24e20,&gStack_24e48);
            if (bVar2) {
              if (gStack_24e48.result != pgn_none) {
                if (bVar7 != false) {
                  std::vector<game,_std::allocator<game>_>::push_back(&this->games,&gStack_24e48);
                }
                if (gStack_24e48.moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                    super__Vector_impl_data._M_finish !=
                    gStack_24e48.moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                    super__Vector_impl_data._M_start) {
                  gStack_24e48.moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       gStack_24e48.moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                       super__Vector_impl_data._M_start;
                }
                gStack_24e48.result = pgn_none;
                gStack_24e48.white_elo = 0;
                gStack_24e48.black_elo = 0;
                position::clear(&pStack_248f0);
                std::__cxx11::istringstream::istringstream
                          (aiStack_24c78,(string *)&START_FEN_abi_cxx11_,_S_in);
                position::setup(&pStack_248f0,(istringstream *)aiStack_24c78);
                std::__cxx11::istringstream::~istringstream(aiStack_24c78);
                std::ios_base::~ios_base(aiStack_24c00);
                bVar7 = bVar2;
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"..error parsing line: ",0x16);
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,bStack_24e20._M_dataplus._M_p,
                                  bStack_24e20._M_string_length);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
              std::ostream::put((char)poVar4);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"..from file ",0xc);
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,(pbVar8->_M_dataplus)._M_p,
                                  pbVar8->_M_string_length);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
              std::ostream::put((char)poVar4);
              std::ostream::flush();
              bVar7 = bVar2;
            }
          }
        }
        std::ifstream::close();
        std::__cxx11::istringstream::~istringstream(aiStack_24df8);
        std::ios_base::~ios_base(aiStack_24d80);
        position::~position(&pStack_248f0);
        if (gStack_24e48.moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(gStack_24e48.moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl
                          .super__Vector_impl_data._M_start,
                          (long)gStack_24e48.moves.super__Vector_base<Move,_std::allocator<Move>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)gStack_24e48.moves.super__Vector_base<Move,_std::allocator<Move>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)bStack_24e20._M_dataplus._M_p != &bStack_24e20.field_2) {
          operator_delete(bStack_24e20._M_dataplus._M_p,
                          CONCAT71(bStack_24e20.field_2._M_allocated_capacity._1_7_,
                                   bStack_24e20.field_2._M_local_buf[0]) + 1);
        }
      }
      std::ifstream::~ifstream((istream *)alStack_24af8);
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != pbStack_24e00);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"..parsed ",9);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," chess games.",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return true;
}

Assistant:

bool pgn::parse_files() {

	size_t fcount = 0;
	for (const auto& f : pgn_files) {

		std::cout << "..parsing games from " << f << std::endl;

		std::ifstream pgn_file(f.c_str(), std::fstream::in);


		if (!pgn_file.is_open()) {
			std::cout << "..failed to open pgn file, skipping" << std::endl;
			continue;
		}

		std::string line;
		game g;

		position p;
		std::istringstream fen(START_FEN);
		p.setup(fen); // start position for each game
		bool success = true;

		while (std::getline(pgn_file, line)) {

			if (is_empty(line) || is_header(line)) {
				if (is_elo(line)) parse_elo(g, line);
				continue;
			}

			if (!parse_moves(p, line, g)) {
				std::cout << "..error parsing line: " << line << std::endl;
				std::cout << "..from file " << f << std::endl;
				success = false;
				continue;
			}

			if (g.finished()) {
				if (success) games.push_back(g);
				g.clear();
				p.clear();
				std::istringstream tmp(START_FEN);
				p.setup(tmp);
				success = true;
			}
		}

		++fcount;
		pgn_file.close();

	}
	std::cout << "..parsed " << games.size() << " chess games." << std::endl;

	return true;
}